

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_vector_quantity.cpp
# Opt level: O1

void __thiscall
polyscope::SurfaceVertexTangentVectorQuantity::buildVertexInfoGUI
          (SurfaceVertexTangentVectorQuantity *this,size_t iV)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  float fVar3;
  vec<2,_float,_(glm::qualifier)0> vVar4;
  undefined8 extraout_XMM0_Qb;
  stringstream buffer;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_1d8;
  char *local_1b8;
  char local_1a8 [16];
  stringstream local_198 [16];
  long local_188;
  undefined8 local_180 [13];
  ios_base local_118 [264];
  
  ImGui::TextUnformatted(*(char **)&(this->super_SurfaceVectorQuantity).field_0x148,(char *)0x0);
  ImGui::NextColumn();
  vVar4 = render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>::getValue
                    (&(this->
                      super_TangentVectorQuantity<polyscope::SurfaceVertexTangentVectorQuantity>).
                      tangentVectors,iV);
  local_1d8 = vVar4.field_0;
  std::__cxx11::stringstream::stringstream(local_198);
  *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 9;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_188,"<",1);
  poVar2 = std::ostream::_M_insert<double>((double)local_1d8.x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  auVar1._8_8_ = extraout_XMM0_Qb;
  auVar1._0_4_ = vVar4.field_0;
  auVar1._4_4_ = vVar4.field_1;
  auVar1 = vmovshdup_avx(auVar1);
  fVar3 = auVar1._0_4_;
  poVar2 = std::ostream::_M_insert<double>((double)fVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,">",1);
  std::__cxx11::stringbuf::str();
  ImGui::TextUnformatted(local_1b8,(char *)0x0);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  ImGui::NextColumn();
  ImGui::NextColumn();
  fVar3 = local_1d8.x * local_1d8.x + fVar3 * fVar3;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    auVar1 = vsqrtss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
    fVar3 = auVar1._0_4_;
  }
  ImGui::Text("magnitude: %g",(double)fVar3);
  ImGui::NextColumn();
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void SurfaceVertexTangentVectorQuantity::buildVertexInfoGUI(size_t iV) {
  ImGui::TextUnformatted(name.c_str());
  ImGui::NextColumn();

  glm::vec2 vec = tangentVectors.getValue(iV);

  std::stringstream buffer;
  buffer << vec;
  ImGui::TextUnformatted(buffer.str().c_str());

  ImGui::NextColumn();
  ImGui::NextColumn();
  ImGui::Text("magnitude: %g", glm::length(vec));
  ImGui::NextColumn();
}